

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O2

void __thiscall baryonyx::pnm_vector::~pnm_vector(pnm_vector *this)

{
  long lVar1;
  
  lVar1 = this->m_heigth;
  while (0 < lVar1) {
    std::ostream::write((char *)&this->m_ofs,
                        (long)(this->m_buffer)._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    lVar1 = this->m_heigth + -1;
    this->m_heigth = lVar1;
  }
  std::ofstream::~ofstream(&this->m_ofs);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&this->m_buffer);
  return;
}

Assistant:

~pnm_vector()
    {
        for (; m_heigth > 0; --m_heigth)
            m_ofs.write(reinterpret_cast<char*>(m_buffer.get()), size());
    }